

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef rec_upvalue(jit_State *J,uint32_t uv,TRef val)

{
  GCupval *uvp_00;
  undefined8 *puVar1;
  bool bVar2;
  ushort uVar3;
  IRRef1 IVar4;
  int iVar5;
  TRef TVar6;
  TRef TVar7;
  uint uVar8;
  uint uVar9;
  TRef local_12c;
  TRef local_110;
  TRef res;
  IRType t;
  int32_t slot;
  TRef kfunc;
  TRef tr;
  int needbarrier;
  IRRef uref;
  TRef fn;
  GCupval *uvp;
  TRef val_local;
  uint32_t uv_local;
  jit_State *J_local;
  uint local_14;
  
  uvp_00 = *(GCupval **)((long)J->fn + (ulong)uv * 8 + 0x28);
  needbarrier = getcurrf(J);
  IVar4 = (IRRef1)needbarrier;
  bVar2 = false;
  iVar5 = rec_upvalue_constify(J,uvp_00);
  needbarrier._0_2_ = IVar4;
  if (iVar5 != 0) {
    if (0x7fff < (needbarrier & 0xffffU)) {
      if (0x5f < J->pt->flags) goto LAB_0015a66a;
      needbarrier = lj_ir_kgc(J,(GCobj *)J->fn,IRT_FUNC);
      (J->fold).ins.field_0.ot = 0x888;
      (J->fold).ins.field_0.op1 = IVar4;
      (J->fold).ins.field_0.op2 = (IRRef1)needbarrier;
      lj_opt_fold(J);
      J->base[-2] = needbarrier;
    }
    TVar6 = lj_record_constify(J,(cTValue *)(uvp_00->v).ptr64);
    if (TVar6 != 0) {
      return TVar6;
    }
  }
LAB_0015a66a:
  uVar8 = uvp_00->dhash + 0xfb3ee249;
  uVar9 = uVar8 * 0x4000 | uVar8 >> 0x12;
  iVar5 = (uVar8 ^ uvp_00->dhash) - uVar9;
  uVar3 = (ushort)(uv << 8) |
          ((ushort)iVar5 ^ ((ushort)(uVar9 << 5) | (ushort)(uVar8 * 0x4000 >> 0x1b))) -
          (ushort)((uint)iVar5 >> 0x13) & 0xff;
  if (uvp_00->closed == '\0') {
    (J->fold).ins.field_0.ot = 0x3c89;
    (J->fold).ins.field_0.op1 = (IRRef1)needbarrier;
    (J->fold).ins.field_0.op2 = uVar3;
    TVar6 = lj_opt_fold(J);
    IVar4 = (IRRef1)TVar6;
    if ((((J->L->stack).ptr64 <= (uvp_00->v).ptr64) && ((uvp_00->v).ptr64 < (J->L->maxstack).ptr64))
       && (iVar5 = (int)((long)((uvp_00->v).ptr64 - (long)(J->L->base + -(ulong)J->baseslot)) >> 3),
          -1 < iVar5)) {
      TVar6 = lj_ir_kint(J,(iVar5 + -2) * -8);
      (J->fold).ins.field_0.ot = 0x2909;
      (J->fold).ins.field_0.op1 = IVar4;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
      TVar6 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x889;
      (J->fold).ins.field_0.op1 = 0x8000;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
      lj_opt_fold(J);
      iVar5 = iVar5 - J->baseslot;
      if (val == 0) {
        if (J->base[iVar5] == 0) {
          local_12c = sload(J,iVar5);
        }
        else {
          local_12c = J->base[iVar5];
        }
        return local_12c;
      }
      J->base[iVar5] = val;
      if ((int)J->maxslot <= iVar5) {
        J->maxslot = iVar5 + 1;
      }
      return 0;
    }
    (J->fold).ins.field_0.ot = 0x2a09;
    (J->fold).ins.field_0.op1 = IVar4;
    (J->fold).ins.field_0.op2 = 0x8000;
    TVar6 = lj_opt_fold(J);
    TVar7 = lj_ir_kint(J,(J->baseslot + J->maxslot) * 8);
    (J->fold).ins.field_0.ot = 0x789;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
    lj_opt_fold(J);
  }
  else {
    bVar2 = true;
    (J->fold).ins.field_0.ot = 0x3d89;
    (J->fold).ins.field_0.op1 = (IRRef1)needbarrier;
    (J->fold).ins.field_0.op2 = uVar3;
    TVar6 = lj_opt_fold(J);
    IVar4 = (IRRef1)TVar6;
  }
  if (val == 0) {
    puVar1 = (undefined8 *)(uvp_00->v).ptr64;
    if ((uint)((long)*puVar1 >> 0x2f) < 0xfffffff2) {
      local_14 = 0xe;
    }
    else {
      local_14 = (uint)((long)*puVar1 >> 0x2f) ^ 0xffffffff;
    }
    (J->fold).ins.field_0.ot = (ushort)local_14 | 0x4480;
    (J->fold).ins.field_0.op1 = IVar4;
    (J->fold).ins.field_0.op2 = 0;
    local_110 = lj_opt_fold(J);
    if (local_14 < 3) {
      local_110 = local_14 * 0xffffff + 0x7fff;
    }
    J_local._4_4_ = local_110;
  }
  else {
    uvp._0_4_ = val;
    if ((val >> 0x18 & 0x1f) - 0xf < 5) {
      (J->fold).ins.field_0.ot = 0x5b0e;
      (J->fold).ins.field_0.op1 = (IRRef1)val;
      (J->fold).ins.field_0.op2 = 0x1d3;
      uvp._0_4_ = lj_opt_fold(J);
    }
    (J->fold).ins.field_0.ot = (byte)((TRef)uvp >> 0x18) & 0x1f | 0x4c00;
    (J->fold).ins.field_0.op1 = IVar4;
    (J->fold).ins.field_0.op2 = (IRRef1)(TRef)uvp;
    lj_opt_fold(J);
    if ((bVar2) && (((TRef)uvp >> 0x18 & 0x1f) - 4 < 9)) {
      (J->fold).ins.field_0.ot = 0x5900;
      (J->fold).ins.field_0.op1 = IVar4;
      (J->fold).ins.field_0.op2 = (IRRef1)(TRef)uvp;
      lj_opt_fold(J);
    }
    J->needsnap = '\x01';
    J_local._4_4_ = 0;
  }
  return J_local._4_4_;
}

Assistant:

static TRef rec_upvalue(jit_State *J, uint32_t uv, TRef val)
{
  GCupval *uvp = &gcref(J->fn->l.uvptr[uv])->uv;
  TRef fn = getcurrf(J);
  IRRef uref;
  int needbarrier = 0;
  if (rec_upvalue_constify(J, uvp)) {  /* Try to constify immutable upvalue. */
    TRef tr, kfunc;
    lj_assertJ(val == 0, "bad usage");
    if (!tref_isk(fn)) {  /* Late specialization of current function. */
      if (J->pt->flags >= PROTO_CLC_POLY)
	goto noconstify;
      kfunc = lj_ir_kfunc(J, J->fn);
      emitir(IRTG(IR_EQ, IRT_FUNC), fn, kfunc);
#if LJ_FR2
      J->base[-2] = kfunc;
#else
      J->base[-1] = kfunc | TREF_FRAME;
#endif
      fn = kfunc;
    }
    tr = lj_record_constify(J, uvval(uvp));
    if (tr)
      return tr;
  }
noconstify:
  /* Note: this effectively limits LJ_MAX_UPVAL to 127. */
  uv = (uv << 8) | (hashrot(uvp->dhash, uvp->dhash + HASH_BIAS) & 0xff);
  if (!uvp->closed) {
    uref = tref_ref(emitir(IRTG(IR_UREFO, IRT_PGC), fn, uv));
    /* In current stack? */
    if (uvval(uvp) >= tvref(J->L->stack) &&
	uvval(uvp) < tvref(J->L->maxstack)) {
      int32_t slot = (int32_t)(uvval(uvp) - (J->L->base - J->baseslot));
      if (slot >= 0) {  /* Aliases an SSA slot? */
	emitir(IRTG(IR_EQ, IRT_PGC),
	       REF_BASE,
	       emitir(IRT(IR_ADD, IRT_PGC), uref,
		      lj_ir_kint(J, (slot - 1 - LJ_FR2) * -8)));
	slot -= (int32_t)J->baseslot;  /* Note: slot number may be negative! */
	if (val == 0) {
	  return getslot(J, slot);
	} else {
	  J->base[slot] = val;
	  if (slot >= (int32_t)J->maxslot) J->maxslot = (BCReg)(slot+1);
	  return 0;
	}
      }
    }
    emitir(IRTG(IR_UGT, IRT_PGC),
	   emitir(IRT(IR_SUB, IRT_PGC), uref, REF_BASE),
	   lj_ir_kint(J, (J->baseslot + J->maxslot) * 8));
  } else {
    needbarrier = 1;
    uref = tref_ref(emitir(IRTG(IR_UREFC, IRT_PGC), fn, uv));
  }
  if (val == 0) {  /* Upvalue load */
    IRType t = itype2irt(uvval(uvp));
    TRef res = emitir(IRTG(IR_ULOAD, t), uref, 0);
    if (irtype_ispri(t)) res = TREF_PRI(t);  /* Canonicalize primitive refs. */
    return res;
  } else {  /* Upvalue store. */
    /* Convert int to number before storing. */
    if (!LJ_DUALNUM && tref_isinteger(val))
      val = emitir(IRTN(IR_CONV), val, IRCONV_NUM_INT);
    emitir(IRT(IR_USTORE, tref_type(val)), uref, val);
    if (needbarrier && tref_isgcv(val))
      emitir(IRT(IR_OBAR, IRT_NIL), uref, val);
    J->needsnap = 1;
    return 0;
  }
}